

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O1

int forcingStep_Reset(ARKodeMem ark_mem,sunrealtype tR,N_Vector yR)

{
  undefined8 *puVar1;
  int iVar2;
  int line;
  char *msgfmt;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"forcingStep_Reset",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    iVar2 = SUNStepper_Reset(tR,*puVar1,yR);
    if (iVar2 == 0) {
      iVar2 = SUNStepper_Reset(tR,puVar1[1],yR);
      if (iVar2 == 0) {
        return 0;
      }
      msgfmt = "Resetting the second partition SUNStepper failed";
      line = 0x85;
    }
    else {
      msgfmt = "Resetting the first partition SUNStepper failed";
      line = 0x7d;
    }
    iVar2 = -0x33;
    arkProcessError(ark_mem,-0x33,line,"forcingStep_Reset",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                    ,msgfmt);
  }
  return iVar2;
}

Assistant:

static int forcingStep_Reset(ARKodeMem ark_mem, sunrealtype tR, N_Vector yR)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  SUNErrCode err = SUNStepper_Reset(step_mem->stepper[0], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the first partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_Reset(step_mem->stepper[1], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the second partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  return ARK_SUCCESS;
}